

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O3

void __thiscall
PRED<UF>::PerformLabelingMem
          (PRED<UF> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar5;
  Mat1b *pMVar6;
  long lVar7;
  long lVar8;
  pointer puVar9;
  pointer puVar10;
  int iVar11;
  pointer puVar12;
  pointer piVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 (*pauVar20) [16];
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  double dVar33;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_2d8 [104];
  Mat local_270 [16];
  long local_260;
  long *local_228;
  long local_210;
  PRED<UF> *local_208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  undefined1 local_1d8 [104];
  Mat local_170 [16];
  long local_160;
  long *local_128;
  Size local_110;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  local_200 = accesses;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1d8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110.height = (int)uVar2;
  local_110.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2d8,&local_110,0);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UF::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  piVar13 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  *UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  puVar12 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  *UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  UF::length_ = 1;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar16 = *(uint *)&pMVar6->field_0x8;
  iVar25 = *(int *)&pMVar6->field_0xc;
  if (0 < iVar25) {
    iVar24 = 0;
    do {
      lVar28 = (long)iVar24;
      piVar1 = (int *)(local_160 + lVar28 * 4);
      *piVar1 = *piVar1 + 1;
      uVar15 = UF::length_;
      if (*(char *)(local_1d8._24_8_ + lVar28) != '\0') {
        lVar27 = (long)(int)UF::length_;
        piVar13[lVar27] = piVar13[lVar27] + 1;
        puVar12[lVar27] = uVar15;
        uVar15 = UF::length_;
        UF::length_ = UF::length_ + 1;
        piVar1 = (int *)(local_260 + lVar28 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2d8._24_8_ + lVar28 * 4) = uVar15;
        lVar28 = lVar28 + 1;
        if (iVar25 <= (int)lVar28) break;
        lVar27 = 0;
        while( true ) {
          piVar1 = (int *)(local_160 + lVar28 * 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1d8._24_8_ + lVar28 + lVar27) == '\0') break;
          lVar17 = (long)(iVar24 + (int)lVar27);
          piVar1 = (int *)(local_260 + lVar17 * 4);
          *piVar1 = *piVar1 + 1;
          uVar5 = *(undefined4 *)(local_2d8._24_8_ + lVar17 * 4);
          piVar1 = (int *)(local_260 + lVar28 * 4 + lVar27 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2d8._24_8_ + lVar28 * 4 + lVar27 * 4) = uVar5;
          lVar27 = lVar27 + 1;
          if ((1 - iVar25) + iVar24 + (int)lVar27 == 0) goto LAB_001a126b;
        }
        iVar24 = iVar24 + (int)lVar27 + 1;
      }
      iVar24 = iVar24 + 1;
    } while (iVar24 < iVar25);
  }
LAB_001a126b:
  local_208 = this;
  if (1 < (int)uVar16) {
    iVar25 = iVar25 + -1;
    lVar28 = (long)iVar25;
    local_1e8 = lVar28 + -1;
    local_1f0 = -lVar28;
    uVar32 = 1;
    lVar27 = 0;
    do {
      lVar17 = *local_128;
      piVar1 = (int *)(local_160 + lVar17 * uVar32);
      *piVar1 = *piVar1 + 1;
      lVar31 = *(long *)local_1d8._80_8_;
      cVar3 = *(char *)(local_1d8._24_8_ + lVar31 * uVar32);
      if (iVar25 == 0) {
        if (cVar3 != '\0') {
          lVar18 = uVar32 - 1;
          piVar1 = (int *)(local_160 + lVar17 * lVar18);
          *piVar1 = *piVar1 + 1;
          uVar15 = UF::length_;
          if (*(char *)(local_1d8._24_8_ + lVar31 * lVar18) == '\0') {
            lVar17 = (long)(int)UF::length_;
            UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] =
                 UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar17] + 1;
            UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] = uVar15;
            uVar15 = UF::length_;
            UF::length_ = UF::length_ + 1;
            piVar1 = (int *)(local_260 + *local_228 * uVar32);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2d8._24_8_ + *(long *)local_2d8._80_8_ * uVar32) = uVar15;
          }
          else {
            lVar17 = *local_228;
            piVar1 = (int *)(local_260 + lVar17 * lVar18);
            *piVar1 = *piVar1 + 1;
            lVar31 = *(long *)local_2d8._80_8_;
            uVar5 = *(undefined4 *)(local_2d8._24_8_ + lVar18 * lVar31);
            piVar1 = (int *)(local_260 + lVar17 * uVar32);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2d8._24_8_ + lVar31 * uVar32) = uVar5;
          }
        }
      }
      else {
        lVar18 = lVar28;
        if (cVar3 == '\0') {
          uVar29 = 0;
          goto LAB_001a13c6;
        }
        lVar19 = uVar32 - 1;
        piVar1 = (int *)(local_160 + lVar17 * lVar19);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_1d8._24_8_ + lVar31 * lVar19) == '\0') {
          piVar1 = (int *)(local_160 + 4 + lVar17 * lVar19);
          *piVar1 = *piVar1 + 1;
          uVar15 = UF::length_;
          if (*(char *)(local_1d8._24_8_ + 1 + lVar31 * lVar19) == '\0') {
            lVar17 = (long)(int)UF::length_;
            UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] =
                 UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar17] + 1;
            UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] = uVar15;
            uVar15 = UF::length_;
            UF::length_ = UF::length_ + 1;
            piVar1 = (int *)(local_260 + *local_228 * uVar32);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2d8._24_8_ + *(long *)local_2d8._80_8_ * uVar32) = uVar15;
            iVar24 = 0;
            goto LAB_001a19af;
          }
          lVar17 = *local_228;
          piVar1 = (int *)(local_260 + 4 + lVar17 * lVar19);
          *piVar1 = *piVar1 + 1;
          lVar31 = *(long *)local_2d8._80_8_;
          uVar5 = *(undefined4 *)(local_2d8._24_8_ + 4 + lVar19 * lVar31);
          piVar1 = (int *)(local_260 + lVar17 * uVar32);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2d8._24_8_ + lVar31 * uVar32) = uVar5;
          uVar29 = 0;
          goto LAB_001a1c21;
        }
        lVar17 = *local_228;
        piVar1 = (int *)(local_260 + lVar17 * lVar19);
        *piVar1 = *piVar1 + 1;
        lVar31 = *(long *)local_2d8._80_8_;
        uVar5 = *(undefined4 *)(local_2d8._24_8_ + lVar19 * lVar31);
        piVar1 = (int *)(local_260 + lVar17 * uVar32);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2d8._24_8_ + lVar31 * uVar32) = uVar5;
        uVar29 = 0;
LAB_001a1cc6:
        iVar24 = (int)uVar29;
        if (iVar24 + 1 < iVar25) {
          lVar31 = *local_128;
          lVar19 = *(long *)local_1d8._80_8_;
          local_1f8 = uVar32 - 1;
          local_210 = lVar31 * local_1f8 + local_160;
          local_1e0 = lVar19 * local_1f8 + local_1d8._24_8_;
          lVar30 = (long)iVar24;
          lVar17 = local_2d8._24_8_ + 4 + lVar30 * 4;
          lVar22 = local_260 + lVar30 * 4 + 4;
          lVar21 = 0;
          while( true ) {
            piVar1 = (int *)(lVar31 * uVar32 + lVar30 * 4 + local_160 + 4 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar19 * uVar32 + lVar30 + local_1d8._24_8_ + 1 + lVar21) == '\0') {
              uVar29 = (ulong)(uint)((int)(lVar30 + 1) + (int)lVar21);
              goto LAB_001a13c6;
            }
            piVar1 = (int *)(local_160 + lVar31 * lVar27 + lVar30 * 4 + 4 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1d8._24_8_ + lVar19 * lVar27 + lVar30 + 1 + lVar21) == '\0') break;
            lVar26 = *local_228;
            piVar1 = (int *)(lVar27 * lVar26 + lVar22 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            lVar23 = *(long *)local_2d8._80_8_;
            uVar5 = *(undefined4 *)(lVar27 * lVar23 + lVar17 + lVar21 * 4);
            piVar1 = (int *)(lVar26 * uVar32 + lVar22 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar23 * uVar32 + lVar17 + lVar21 * 4) = uVar5;
            lVar21 = lVar21 + 1;
            if (local_1f0 + lVar30 + 1 + lVar21 == 0) {
              iVar24 = iVar24 + (int)lVar21;
              goto LAB_001a1e38;
            }
          }
          iVar11 = iVar24 + (int)lVar21;
          lVar19 = (long)(iVar11 + 2);
          piVar1 = (int *)(local_210 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          uVar29 = lVar30 + 1 + lVar21;
          iVar24 = (int)uVar29;
          cVar3 = *(char *)(local_1e0 + lVar19);
          lVar17 = *local_228;
          lVar22 = lVar17 * uVar32 + local_260;
          piVar1 = (int *)(lVar22 + (long)iVar11 * 4);
          *piVar1 = *piVar1 + 1;
          lVar31 = *(long *)local_2d8._80_8_;
          lVar26 = lVar31 * uVar32 + local_2d8._24_8_;
          uVar15 = *(uint *)(lVar26 + (long)iVar11 * 4);
          if (cVar3 == '\0') {
            piVar1 = (int *)(lVar22 + lVar30 * 4 + 4 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(lVar26 + lVar30 * 4 + 4 + lVar21 * 4) = uVar15;
            goto LAB_001a19af;
          }
          piVar1 = (int *)(local_260 + lVar17 * local_1f8 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          uVar15 = UF::MemMerge(uVar15,*(uint *)(local_2d8._24_8_ + lVar31 * local_1f8 + lVar19 * 4)
                               );
          piVar1 = (int *)(*local_228 * uVar32 + local_260 + lVar30 * 4 + 4 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)local_2d8._80_8_ * uVar32 + local_2d8._24_8_ + lVar30 * 4 + 4 +
                   lVar21 * 4) = uVar15;
LAB_001a1c21:
          lVar17 = (long)(int)uVar29;
          piVar1 = (int *)(*local_128 * uVar32 + local_160 + 4 + lVar17 * 4);
          *piVar1 = *piVar1 + 1;
          uVar29 = lVar17 + 1;
          cVar3 = *(char *)(lVar17 + 1 + *(long *)local_1d8._80_8_ * uVar32 + local_1d8._24_8_);
          if (iVar25 <= (int)uVar29) {
            if (cVar3 != '\0') {
              lVar31 = *local_228;
              piVar1 = (int *)(lVar31 * (uVar32 - 1) + local_260 + 4 + lVar17 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = *(long *)local_2d8._80_8_;
              uVar5 = *(undefined4 *)((uVar32 - 1) * lVar18 + local_2d8._24_8_ + 4 + lVar17 * 4);
              piVar1 = (int *)(lVar31 * uVar32 + local_260 + 4 + lVar17 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar18 * uVar32 + local_2d8._24_8_ + 4 + lVar17 * 4) = uVar5;
            }
            goto LAB_001a2079;
          }
          if (cVar3 != '\0') {
            lVar31 = *local_228;
            piVar1 = (int *)(lVar31 * (uVar32 - 1) + local_260 + 4 + lVar17 * 4);
            *piVar1 = *piVar1 + 1;
            lVar19 = *(long *)local_2d8._80_8_;
            uVar5 = *(undefined4 *)((uVar32 - 1) * lVar19 + local_2d8._24_8_ + 4 + lVar17 * 4);
            piVar1 = (int *)(lVar31 * uVar32 + local_260 + 4 + lVar17 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar19 * uVar32 + local_2d8._24_8_ + 4 + lVar17 * 4) = uVar5;
            goto LAB_001a1cc6;
          }
LAB_001a13c6:
          while( true ) {
            lVar21 = (long)(int)uVar29;
            lVar17 = local_160 + lVar21 * 4;
            lVar31 = lVar21 << 0x20;
            lVar19 = 0;
            do {
              lVar22 = lVar31;
              lVar30 = lVar22 >> 0x20;
              if (lVar28 <= lVar19 + lVar21 + 1) {
                lVar17 = *local_128;
                lVar18 = lVar22 + 0x100000000 >> 0x20;
                piVar1 = (int *)((lVar22 + 0x100000000 >> 0x1e) + lVar17 * uVar32 + local_160);
                *piVar1 = *piVar1 + 1;
                lVar31 = *(long *)local_1d8._80_8_;
                if (*(char *)(lVar18 + lVar31 * uVar32 + local_1d8._24_8_) != '\0') {
                  lVar19 = uVar32 - 1;
                  lVar17 = local_160 + lVar17 * lVar19;
                  piVar1 = (int *)(lVar17 + lVar18 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar31 = local_1d8._24_8_ + lVar31 * lVar19;
                  if (*(char *)(lVar18 + lVar31) == '\0') {
                    piVar1 = (int *)(lVar17 + (lVar22 >> 0x1e));
                    *piVar1 = *piVar1 + 1;
                    uVar15 = UF::length_;
                    if (*(char *)(lVar31 + lVar30) == '\0') {
                      lVar17 = (long)(int)UF::length_;
                      UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar17] =
                           UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar17] + 1;
                      UF::mem_P_.vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar17] = uVar15;
                      uVar15 = UF::length_;
                      UF::length_ = UF::length_ + 1;
                      piVar1 = (int *)(*local_228 * uVar32 + local_260 + lVar18 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(uint *)(*(long *)local_2d8._80_8_ * uVar32 + local_2d8._24_8_ + lVar18 * 4)
                           = uVar15;
                    }
                    else {
                      lVar17 = *local_228;
                      piVar1 = (int *)(lVar17 * lVar19 + local_260 + lVar30 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar31 = *(long *)local_2d8._80_8_;
                      uVar5 = *(undefined4 *)(lVar19 * lVar31 + local_2d8._24_8_ + lVar30 * 4);
                      piVar1 = (int *)(lVar17 * uVar32 + local_260 + lVar18 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(lVar31 * uVar32 + local_2d8._24_8_ + lVar18 * 4) = uVar5;
                    }
                  }
                  else {
                    lVar17 = *local_228;
                    piVar1 = (int *)(lVar17 * lVar19 + local_260 + lVar18 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar31 = *(long *)local_2d8._80_8_;
                    uVar5 = *(undefined4 *)(lVar19 * lVar31 + local_2d8._24_8_ + lVar18 * 4);
                    piVar1 = (int *)(lVar17 * uVar32 + local_260 + lVar18 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar31 * uVar32 + local_2d8._24_8_ + lVar18 * 4) = uVar5;
                  }
                }
                goto LAB_001a2079;
              }
              lVar7 = *local_128;
              piVar1 = (int *)(uVar32 * lVar7 + lVar17 + 4 + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              lVar8 = *(long *)local_1d8._80_8_;
              lVar26 = lVar19 + 1;
              lVar23 = lVar19 + 1;
              lVar31 = lVar22 + 0x100000000;
              lVar19 = lVar26;
            } while (*(char *)(lVar23 + uVar32 * lVar8 + local_1d8._24_8_ + lVar21) == '\0');
            uVar29 = (uVar29 & 0xffffffff) + lVar26;
            iVar24 = (int)uVar29;
            piVar1 = (int *)(lVar17 + lVar27 * lVar7 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar26 + local_1d8._24_8_ + lVar21 + lVar27 * lVar8) != '\0') {
              lVar17 = *local_228;
              piVar1 = (int *)(lVar17 * lVar27 + local_260 + lVar21 * 4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              lVar31 = *(long *)local_2d8._80_8_;
              uVar5 = *(undefined4 *)(lVar31 * lVar27 + local_2d8._24_8_ + lVar21 * 4 + lVar26 * 4);
              piVar1 = (int *)(lVar17 * uVar32 + local_260 + lVar21 * 4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar31 * uVar32 + local_2d8._24_8_ + lVar21 * 4 + lVar26 * 4) = uVar5;
              goto LAB_001a1cc6;
            }
            lVar17 = uVar32 - 1;
            lVar19 = local_160 + lVar7 * lVar17;
            lVar31 = local_1d8._24_8_ + lVar8 * lVar17;
            piVar1 = (int *)(lVar19 + (lVar22 + 0x200000000 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            lVar23 = lVar22 + 0x200000000 >> 0x20;
            cVar3 = *(char *)(lVar31 + lVar23);
            piVar1 = (int *)(lVar19 + (lVar22 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            uVar15 = UF::length_;
            cVar4 = *(char *)(lVar31 + lVar30);
            if (cVar3 != '\0') {
              lVar31 = *local_228;
              lVar19 = lVar31 * lVar17 + local_260;
              if (cVar4 == '\0') {
                piVar1 = (int *)(lVar19 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar19 = *(long *)local_2d8._80_8_;
                uVar5 = *(undefined4 *)(lVar17 * lVar19 + local_2d8._24_8_ + lVar23 * 4);
                piVar1 = (int *)(local_260 + lVar31 * uVar32 + lVar21 * 4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar19 * uVar32 + local_2d8._24_8_ + lVar21 * 4 + lVar26 * 4) =
                     uVar5;
              }
              else {
                piVar1 = (int *)(lVar19 + lVar30 * 4);
                *piVar1 = *piVar1 + 1;
                lVar17 = lVar17 * *(long *)local_2d8._80_8_ + local_2d8._24_8_;
                uVar15 = *(uint *)(lVar17 + lVar30 * 4);
                piVar1 = (int *)(lVar19 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                uVar15 = UF::MemMerge(uVar15,*(uint *)(lVar17 + lVar23 * 4));
                piVar1 = (int *)(*local_228 * uVar32 + local_260 + lVar21 * 4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2d8._80_8_ * uVar32 + local_2d8._24_8_ + lVar21 * 4 +
                         lVar26 * 4) = uVar15;
              }
              goto LAB_001a1c21;
            }
            if (cVar4 == '\0') {
              lVar17 = (long)(int)UF::length_;
              UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar17] =
                   UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17] + 1;
              UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar17] = uVar15;
              uVar15 = UF::length_;
              UF::length_ = UF::length_ + 1;
              piVar1 = (int *)(*local_228 * uVar32 + local_260 + lVar21 * 4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2d8._80_8_ * uVar32 + local_2d8._24_8_ + lVar21 * 4 +
                       lVar26 * 4) = uVar15;
            }
            else {
              lVar31 = *local_228;
              piVar1 = (int *)(lVar31 * lVar17 + local_260 + lVar30 * 4);
              *piVar1 = *piVar1 + 1;
              lVar19 = *(long *)local_2d8._80_8_;
              uVar5 = *(undefined4 *)(lVar17 * lVar19 + local_2d8._24_8_ + lVar30 * 4);
              piVar1 = (int *)(lVar31 * uVar32 + local_260 + lVar21 * 4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar19 * uVar32 + local_2d8._24_8_ + lVar21 * 4 + lVar26 * 4) = uVar5;
            }
LAB_001a19af:
            if (iVar25 <= iVar24 + 1) break;
            lVar17 = *local_128;
            lVar31 = *(long *)local_1d8._80_8_;
            lVar22 = (long)iVar24;
            lVar19 = lVar22 << 0x20;
            lVar21 = 0;
            while( true ) {
              piVar1 = (int *)(local_160 + lVar17 * uVar32 + lVar22 * 4 + 4 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              local_210 = lVar22;
              if (*(char *)(local_1d8._24_8_ + lVar31 * uVar32 + lVar22 + 1 + lVar21) == '\0')
              break;
              piVar1 = (int *)(lVar17 * lVar27 + lVar22 * 4 + local_160 + 8 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar31 * lVar27 + lVar22 + local_1d8._24_8_ + 2 + lVar21) != '\0') {
                uVar29 = (ulong)(uint)(iVar24 + 1 + (int)lVar21);
                lVar17 = *local_228;
                piVar1 = (int *)((lVar19 >> 0x1e) + lVar17 * uVar32 + local_260);
                *piVar1 = *piVar1 + 1;
                lVar31 = *(long *)local_2d8._80_8_;
                uVar15 = *(uint *)((lVar19 >> 0x1e) + lVar31 * uVar32 + local_2d8._24_8_);
                piVar1 = (int *)(lVar17 * lVar27 + local_260 + lVar22 * 4 + 8 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                uVar15 = UF::MemMerge(uVar15,*(uint *)(lVar31 * lVar27 + local_2d8._24_8_ +
                                                       lVar22 * 4 + 8 + lVar21 * 4));
                piVar1 = (int *)(*local_228 * uVar32 + local_260 + lVar22 * 4 + 4 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2d8._80_8_ * uVar32 + local_2d8._24_8_ + lVar22 * 4 + 4 +
                         lVar21 * 4) = uVar15;
                goto LAB_001a1c21;
              }
              lVar26 = *local_228 * uVar32 + local_260 + lVar22 * 4 + 4;
              piVar1 = (int *)(lVar26 + -4 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar30 = *(long *)local_2d8._80_8_ * uVar32 + local_2d8._24_8_ + lVar22 * 4 + 4;
              uVar5 = *(undefined4 *)(lVar30 + -4 + lVar21 * 4);
              piVar1 = (int *)(lVar26 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar30 + lVar21 * 4) = uVar5;
              lVar19 = lVar19 + 0x100000000;
              lVar21 = lVar21 + 1;
              if (local_1e8 - lVar22 == lVar21) {
                iVar24 = iVar24 + (int)lVar21;
                goto LAB_001a1af4;
              }
            }
            uVar29 = (ulong)(uint)(iVar24 + 1 + (int)lVar21);
          }
          lVar18 = (long)(iVar24 + 1);
LAB_001a1af4:
          piVar1 = (int *)(*local_128 * uVar32 + local_160 + lVar18 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar18 + *(long *)local_1d8._80_8_ * uVar32 + local_1d8._24_8_) == '\0')
          goto LAB_001a2079;
          lVar17 = *local_228 * uVar32 + local_260;
          goto LAB_001a2059;
        }
        lVar18 = (long)(iVar24 + 1);
LAB_001a1e38:
        lVar17 = *local_128;
        piVar1 = (int *)(lVar17 * uVar32 + local_160 + lVar18 * 4);
        *piVar1 = *piVar1 + 1;
        lVar31 = *(long *)local_1d8._80_8_;
        if (*(char *)(lVar18 + lVar31 * uVar32 + local_1d8._24_8_) != '\0') {
          lVar19 = uVar32 - 1;
          piVar1 = (int *)(local_160 + lVar17 * lVar19 + lVar18 * 4);
          *piVar1 = *piVar1 + 1;
          lVar17 = *local_228;
          if (*(char *)(lVar18 + local_1d8._24_8_ + lVar31 * lVar19) == '\0') {
            lVar17 = local_260 + lVar17 * uVar32;
LAB_001a2059:
            piVar1 = (int *)(lVar17 + (long)iVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar31 = *(long *)local_2d8._80_8_ * uVar32 + local_2d8._24_8_;
            uVar5 = *(undefined4 *)(lVar31 + (long)iVar24 * 4);
            piVar1 = (int *)(lVar17 + lVar18 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar31 + lVar18 * 4) = uVar5;
          }
          else {
            piVar1 = (int *)(lVar17 * lVar19 + local_260 + lVar18 * 4);
            *piVar1 = *piVar1 + 1;
            lVar31 = *(long *)local_2d8._80_8_;
            uVar5 = *(undefined4 *)(lVar19 * lVar31 + local_2d8._24_8_ + lVar18 * 4);
            piVar1 = (int *)(lVar17 * uVar32 + local_260 + lVar18 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar31 * uVar32 + local_2d8._24_8_ + lVar18 * 4) = uVar5;
          }
        }
      }
LAB_001a2079:
      uVar32 = uVar32 + 1;
      lVar27 = lVar27 + 1;
    } while (uVar32 != uVar16);
  }
  uVar16 = UF::MemFlatten();
  (local_208->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar16;
  piVar13 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar12 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)local_2d8._0_4_) {
    uVar32 = (ulong)(uint)local_2d8._4_4_;
    lVar28 = 0;
    do {
      if (0 < (int)uVar32) {
        lVar17 = *local_228 * lVar28 + local_260;
        lVar27 = *(long *)local_2d8._80_8_ * lVar28 + local_2d8._24_8_;
        lVar31 = 0;
        do {
          piVar1 = (int *)(lVar17 + lVar31 * 4);
          *piVar1 = *piVar1 + 1;
          iVar25 = *(int *)(lVar27 + lVar31 * 4);
          piVar13[iVar25] = piVar13[iVar25] + 1;
          uVar16 = puVar12[iVar25];
          piVar1 = (int *)(lVar17 + lVar31 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar27 + lVar31 * 4) = uVar16;
          lVar31 = lVar31 + 1;
          uVar32 = (ulong)(int)local_2d8._4_4_;
        } while (lVar31 < (long)uVar32);
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 < (int)local_2d8._0_4_);
  }
  pauVar20 = (undefined1 (*) [16])operator_new(0x20);
  pvVar14 = local_200;
  pauVar20[1] = (undefined1  [16])0x0;
  *pauVar20 = (undefined1  [16])0x0;
  puVar9 = (local_200->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar10 = (local_200->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (local_200->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar20;
  (local_200->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar20 + 2);
  (local_200->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar20 + 2);
  if (puVar9 != (pointer)0x0) {
    operator_delete(puVar9,(long)puVar10 - (long)puVar9);
  }
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_170;
  cv::sum((_InputArray *)&local_f0);
  *(pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_f0._0_8_ - 9.223372036854776e+18) & (long)(double)local_f0._0_8_ >> 0x3f
       | (long)(double)local_f0._0_8_;
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_270;
  cv::sum((_InputArray *)&local_f0);
  puVar9 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar9[1] = (long)((double)local_f0._0_8_ - 9.223372036854776e+18) &
              (long)(double)local_f0._0_8_ >> 0x3f | (long)(double)local_f0._0_8_;
  if ((long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar32 = 0;
  }
  else {
    lVar28 = (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar33 = 0.0;
    lVar27 = 0;
    do {
      dVar33 = dVar33 + (double)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar27];
      lVar27 = lVar27 + 1;
    } while (lVar28 + (ulong)(lVar28 == 0) != lVar27);
    uVar32 = (long)(dVar33 - 9.223372036854776e+18) & (long)dVar33 >> 0x3f | (long)dVar33;
  }
  puVar9[2] = uVar32;
  MemMat<int>::GetImage(&local_f0,(MemMat<int> *)local_2d8);
  cv::Mat::operator=(&((local_208->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                      super_Mat,&local_f0.super_Mat);
  cv::Mat::~Mat(&local_f0.super_Mat);
  cv::Mat::~Mat(local_270);
  cv::Mat::~Mat((Mat *)(local_2d8 + 8));
  cv::Mat::~Mat(local_170);
  cv::Mat::~Mat((Mat *)(local_1d8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {

        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0); 

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // First scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img(r,c)>0
#define CONDITION_P img(r-1,c-1)>0
#define CONDITION_Q img(r-1,c)>0
#define CONDITION_R img(r-1,c+1)>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels(r,c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r,c) = img_labels(r - 1, c - 1); // x <- p
#define ACTION_4 img_labels(r,c) = img_labels(r - 1, c); // x <- q
#define ACTION_5 img_labels(r,c) = img_labels(r - 1, c + 1); // x <- r
#define ACTION_6 img_labels(r,c) = img_labels(r, c - 1); // x <- s
#define ACTION_7 img_labels(r,c) = LabelsSolver::MemMerge(img_labels(r - 1, c - 1), img_labels(r - 1, c + 1)); // x <- p + r
#define ACTION_8 img_labels(r,c) = LabelsSolver::MemMerge(img_labels(r, c - 1), img_labels(r - 1, c + 1)); // x <- s + r

#define COLS w

        {
            int r = 0; 
#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows' for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels.rows; ++r_i) {
            for (int c_i = 0; c_i < img_labels.cols; ++c_i) {
                img_labels(r_i, c_i) = LabelsSolver::MemGetLabel(img_labels(r_i, c_i));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage(); 

        LabelsSolver::MemDealloc();
    }